

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipAnalysis.cpp
# Opt level: O3

void __thiscall HighsMipAnalysis::reportMipSolveLpClock(HighsMipAnalysis *this,bool header)

{
  int __fd;
  int __fd_00;
  int iVar1;
  uint uVar2;
  uint uVar3;
  HighsTimer *this_00;
  pointer piVar4;
  pointer piVar5;
  size_t in_RCX;
  void *in_RDX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  undefined7 in_register_00000031;
  uint uVar6;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double dVar7;
  double dVar8;
  double dVar9;
  
  if ((int)CONCAT71(in_register_00000031,header) != 0) {
    puts(
        ",simplex time,IPM time,#simplex,#IPM,simplex/total time,IPM/total time,#No basis solve,simplex/#Basis solve,simplex/#No basis solve"
        );
    return;
  }
  if (this->analyse_mip_time == true) {
    HighsTimer::read((this->mip_clocks).timer_pointer_,0,in_RDX,in_RCX);
    if (0.01 <= extraout_XMM0_Qa) {
      this_00 = (this->mip_clocks).timer_pointer_;
      piVar4 = (this->mip_clocks).clock_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      __fd = piVar4[0x3a];
      __fd_00 = piVar4[0x3b];
      piVar5 = (this_00->clock_num_call).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = piVar5[piVar4[0x39]];
      uVar2 = piVar5[__fd];
      uVar3 = piVar5[__fd_00];
      HighsTimer::read(this_00,piVar4[0x39],__buf,in_RCX);
      HighsTimer::read((this->mip_clocks).timer_pointer_,__fd,__buf_00,in_RCX);
      dVar7 = extraout_XMM0_Qa_00 + extraout_XMM0_Qa_01;
      HighsTimer::read((this->mip_clocks).timer_pointer_,__fd_00,__buf_01,in_RCX);
      dVar9 = 0.0;
      if (iVar1 < 1) {
        dVar8 = 0.0;
      }
      else {
        dVar8 = extraout_XMM0_Qa_00 / (double)iVar1;
      }
      uVar6 = iVar1 + uVar2;
      if (0 < (int)uVar2) {
        dVar9 = extraout_XMM0_Qa_01 / (double)(int)uVar2;
      }
      printf(",%11.2g,%11.2g,%d,%d,%11.2g,%11.2g,%d,%11.2g,%11.2g\n",dVar7,extraout_XMM0_Qa_02,
             dVar7 / extraout_XMM0_Qa,extraout_XMM0_Qa_02 / extraout_XMM0_Qa,(ulong)uVar6,
             (ulong)uVar3,(ulong)uVar2);
      printf("LP solver analysis: %d LP with %d simplex (%11.2g CPU), %d IPM (%11.2g CPU) and %d solved without basis; average simplex solve time (basis/no_basis) = (%11.2g, %11.2g)\n"
             ,dVar7,extraout_XMM0_Qa_02,dVar8,dVar9,(ulong)(uVar6 + uVar3),(ulong)uVar6,(ulong)uVar3
             ,(ulong)uVar2);
      return;
    }
  }
  return;
}

Assistant:

void HighsMipAnalysis::reportMipSolveLpClock(const bool header) {
  if (header) {
    printf(
        ",simplex time,IPM time,#simplex,#IPM,simplex/total time,IPM/total "
        "time,#No basis solve,simplex/#Basis solve,simplex/#No basis solve\n");
    return;
  }
  if (!analyse_mip_time) return;
  double total_time = mip_clocks.timer_pointer_->read(0);
  if (total_time < 0.01) return;
  HighsInt simplex_basis_solve_iclock =
      mip_clocks.clock_[kMipClockSimplexBasisSolveLp];
  HighsInt simplex_no_basis_solve_iclock =
      mip_clocks.clock_[kMipClockSimplexNoBasisSolveLp];
  HighsInt ipm_solve_iclock = mip_clocks.clock_[kMipClockIpmSolveLp];
  //  HighsInt num_no_basis_solve =
  //  mip_clocks.timer_pointer_->clock_num_call[no_basis_solve_iclock]; HighsInt
  //  num_basis_solve =
  //  mip_clocks.timer_pointer_->clock_num_call[basis_solve_iclock];
  HighsInt num_simplex_basis_solve =
      mip_clocks.timer_pointer_->clock_num_call[simplex_basis_solve_iclock];
  HighsInt num_simplex_no_basis_solve =
      mip_clocks.timer_pointer_->clock_num_call[simplex_no_basis_solve_iclock];
  HighsInt num_ipm_solve =
      mip_clocks.timer_pointer_->clock_num_call[ipm_solve_iclock];
  HighsInt num_simplex_solve =
      num_simplex_basis_solve + num_simplex_no_basis_solve;
  //  assert(num_no_basis_solve+num_basis_solve == num_simplex_solve);
  double simplex_basis_solve_time =
      mip_clocks.timer_pointer_->read(simplex_basis_solve_iclock);
  double simplex_no_basis_solve_time =
      mip_clocks.timer_pointer_->read(simplex_no_basis_solve_iclock);
  double simplex_solve_time =
      simplex_basis_solve_time + simplex_no_basis_solve_time;
  double ipm_solve_time = mip_clocks.timer_pointer_->read(ipm_solve_iclock);
  double frac_simplex_solve_time = simplex_solve_time / total_time;
  double frac_ipm_solve_time = ipm_solve_time / total_time;
  double average_simplex_basis_solve_time =
      num_simplex_basis_solve > 0
          ? simplex_basis_solve_time / int(num_simplex_basis_solve)
          : 0.0;
  double average_simplex_no_basis_solve_time =
      num_simplex_no_basis_solve > 0
          ? simplex_no_basis_solve_time / int(num_simplex_no_basis_solve)
          : 0.0;
  printf(",%11.2g,%11.2g,%d,%d,%11.2g,%11.2g,%d,%11.2g,%11.2g\n",
         simplex_solve_time, ipm_solve_time, int(num_simplex_solve),
         int(num_ipm_solve), frac_simplex_solve_time, frac_ipm_solve_time,
         int(num_simplex_no_basis_solve), average_simplex_basis_solve_time,
         average_simplex_no_basis_solve_time);
  printf(
      "LP solver analysis: %d LP with %d simplex (%11.2g CPU), %d IPM (%11.2g "
      "CPU) and %d solved without basis; average simplex solve time "
      "(basis/no_basis) = (%11.2g, %11.2g)\n",
      int(num_simplex_solve + num_ipm_solve), int(num_simplex_solve),
      simplex_solve_time, int(num_ipm_solve), ipm_solve_time,
      int(num_simplex_no_basis_solve), average_simplex_basis_solve_time,
      average_simplex_no_basis_solve_time);
}